

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void el::base::utils::File::buildStrippedFilename(char *filename,char *buff,size_t limit)

{
  size_t sVar1;
  char *__src;
  
  sVar1 = strlen(filename);
  __src = filename;
  if (((limit <= sVar1) && (__src = filename + (sVar1 - limit), filename[sVar1 - limit] != '.')) &&
     (__src[1] != '.')) {
    __src = __src + 3;
    sVar1 = strlen(buff);
    (buff + sVar1)[0] = '.';
    (buff + sVar1)[1] = '.';
    buff[sVar1 + 2] = '\0';
  }
  strcat(buff,__src);
  return;
}

Assistant:

void File::buildStrippedFilename(const char* filename, char buff[], std::size_t limit) {
  std::size_t sizeOfFilename = strlen(filename);
  if (sizeOfFilename >= limit) {
    filename += (sizeOfFilename - limit);
    if (filename[0] != '.' && filename[1] != '.') {  // prepend if not already
      filename += 3;  // 3 = '..'
      STRCAT(buff, "..", limit);
    }
  }
  STRCAT(buff, filename, limit);
}